

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agc.c
# Opt level: O0

void agc_emax(agc_t *agc,mfcc_t **mfc,int32 n_frame)

{
  int local_20;
  int i;
  int32 n_frame_local;
  mfcc_t **mfc_local;
  agc_t *agc_local;
  
  if (0 < n_frame) {
    for (local_20 = 0; local_20 < n_frame; local_20 = local_20 + 1) {
      if ((float)agc->obs_max <= (float)*mfc[local_20] &&
          (float)*mfc[local_20] != (float)agc->obs_max) {
        agc->obs_max = *mfc[local_20];
        agc->obs_frame = 1;
      }
      *mfc[local_20] = (mfcc_t)((float)*mfc[local_20] - (float)agc->max);
    }
  }
  return;
}

Assistant:

void
agc_emax(agc_t *agc, mfcc_t **mfc, int32 n_frame)
{
    int i;

    if (n_frame <= 0)
        return;
    for (i = 0; i < n_frame; ++i) {
        if (mfc[i][0] > agc->obs_max) {
            agc->obs_max = mfc[i][0];
            agc->obs_frame = 1;
        }
        mfc[i][0] -= agc->max;
    }
}